

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

ImageT<unsigned_int,_4U> * __thiscall
ImageT<unsigned_int,_4U>::yflip(ImageT<unsigned_int,_4U> *this)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  void *__dest;
  ulong __n;
  uint uVar4;
  Color *__src;
  Color *__src_00;
  int iVar5;
  
  uVar1 = (this->super_Image).width;
  __dest = operator_new__((ulong)uVar1 << 4);
  uVar2 = (this->super_Image).height;
  uVar4 = uVar2 - 1;
  if (uVar2 >> 1 <= uVar4) {
    __n = (ulong)(uVar1 << 4);
    iVar5 = 0;
    do {
      uVar3 = (this->super_Image).width;
      __src_00 = this->pixels + uVar3 * uVar4;
      __src = this->pixels + uVar3 * iVar5;
      memcpy(__dest,__src,__n);
      memcpy(__src,__src_00,__n);
      memcpy(__src_00,__dest,__n);
      iVar5 = iVar5 + 1;
      uVar4 = uVar4 - 1;
    } while ((this->super_Image).height >> 1 <= uVar4);
  }
  operator_delete__(__dest);
  return this;
}

Assistant:

virtual ImageT& yflip() override {
        uint32_t rowSize = width * sizeof(Color);
        // Minimize memory use by only buffering a single row.
        Color* rowBuffer = new Color[width];

        for (uint32_t sy = height-1, dy = 0; sy >= height / 2; sy--, dy++) {
            Color* srcRow = &pixels[width * sy];
            Color* dstRow = &pixels[width * dy];

            memcpy(rowBuffer, dstRow, rowSize);
            memcpy(dstRow, srcRow, rowSize);
            memcpy(srcRow, rowBuffer, rowSize);
        }
        delete[] rowBuffer;
        return *this;
    }